

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

bool __thiscall cmCTestLaunch::ParseArguments(cmCTestLaunch *this,int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  int local_44;
  int i_1;
  char *arg;
  int local_30;
  int i;
  int arg0;
  Doing doing;
  char **argv_local;
  int argc_local;
  cmCTestLaunch *this_local;
  
  i = 0;
  local_30 = 0;
  for (arg._4_4_ = 1; local_30 == 0 && arg._4_4_ < argc; arg._4_4_ = arg._4_4_ + 1) {
    __s1 = argv[arg._4_4_];
    iVar2 = strcmp(__s1,"--");
    if (iVar2 == 0) {
      local_30 = arg._4_4_ + 1;
    }
    else {
      iVar2 = strcmp(__s1,"--output");
      if (iVar2 == 0) {
        i = 1;
      }
      else {
        iVar2 = strcmp(__s1,"--source");
        if (iVar2 == 0) {
          i = 2;
        }
        else {
          iVar2 = strcmp(__s1,"--language");
          if (iVar2 == 0) {
            i = 3;
          }
          else {
            iVar2 = strcmp(__s1,"--target-name");
            if (iVar2 == 0) {
              i = 4;
            }
            else {
              iVar2 = strcmp(__s1,"--target-type");
              if (iVar2 == 0) {
                i = 5;
              }
              else {
                iVar2 = strcmp(__s1,"--build-dir");
                if (iVar2 == 0) {
                  i = 6;
                }
                else {
                  iVar2 = strcmp(__s1,"--filter-prefix");
                  if (iVar2 == 0) {
                    i = 8;
                  }
                  else if (i == 1) {
                    std::__cxx11::string::operator=((string *)this,__s1);
                    i = 0;
                  }
                  else if (i == 2) {
                    std::__cxx11::string::operator=((string *)&this->OptionSource,__s1);
                    i = 0;
                  }
                  else if (i == 3) {
                    std::__cxx11::string::operator=((string *)&this->OptionLanguage,__s1);
                    bVar1 = std::operator==(&this->OptionLanguage,"CXX");
                    if (bVar1) {
                      std::__cxx11::string::operator=((string *)&this->OptionLanguage,"C++");
                    }
                    i = 0;
                  }
                  else if (i == 4) {
                    std::__cxx11::string::operator=((string *)&this->OptionTargetName,__s1);
                    i = 0;
                  }
                  else if (i == 5) {
                    std::__cxx11::string::operator=((string *)&this->OptionTargetType,__s1);
                    i = 0;
                  }
                  else if (i == 6) {
                    std::__cxx11::string::operator=((string *)&this->OptionBuildDir,__s1);
                    i = 0;
                  }
                  else if (i == 8) {
                    std::__cxx11::string::operator=((string *)&this->OptionFilterPrefix,__s1);
                    i = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_30 == 0) {
    this->RealArgC = 0;
    this->RealArgV = (char **)0x0;
    std::operator<<((ostream *)&std::cerr,"No launch/command separator (\'--\') found!\n");
    this_local._7_1_ = false;
  }
  else {
    this->RealArgC = argc - local_30;
    this->RealArgV = argv + local_30;
    for (local_44 = 0; local_44 < this->RealArgC; local_44 = local_44 + 1) {
      HandleRealArg(this,this->RealArgV[local_44]);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestLaunch::ParseArguments(int argc, const char* const* argv)
{
  // Launcher options occur first and are separated from the real
  // command line by a '--' option.
  enum Doing
  {
    DoingNone,
    DoingOutput,
    DoingSource,
    DoingLanguage,
    DoingTargetName,
    DoingTargetType,
    DoingBuildDir,
    DoingCount,
    DoingFilterPrefix
  };
  Doing doing = DoingNone;
  int arg0 = 0;
  for (int i = 1; !arg0 && i < argc; ++i) {
    const char* arg = argv[i];
    if (strcmp(arg, "--") == 0) {
      arg0 = i + 1;
    } else if (strcmp(arg, "--output") == 0) {
      doing = DoingOutput;
    } else if (strcmp(arg, "--source") == 0) {
      doing = DoingSource;
    } else if (strcmp(arg, "--language") == 0) {
      doing = DoingLanguage;
    } else if (strcmp(arg, "--target-name") == 0) {
      doing = DoingTargetName;
    } else if (strcmp(arg, "--target-type") == 0) {
      doing = DoingTargetType;
    } else if (strcmp(arg, "--build-dir") == 0) {
      doing = DoingBuildDir;
    } else if (strcmp(arg, "--filter-prefix") == 0) {
      doing = DoingFilterPrefix;
    } else if (doing == DoingOutput) {
      this->OptionOutput = arg;
      doing = DoingNone;
    } else if (doing == DoingSource) {
      this->OptionSource = arg;
      doing = DoingNone;
    } else if (doing == DoingLanguage) {
      this->OptionLanguage = arg;
      if (this->OptionLanguage == "CXX") {
        this->OptionLanguage = "C++";
      }
      doing = DoingNone;
    } else if (doing == DoingTargetName) {
      this->OptionTargetName = arg;
      doing = DoingNone;
    } else if (doing == DoingTargetType) {
      this->OptionTargetType = arg;
      doing = DoingNone;
    } else if (doing == DoingBuildDir) {
      this->OptionBuildDir = arg;
      doing = DoingNone;
    } else if (doing == DoingFilterPrefix) {
      this->OptionFilterPrefix = arg;
      doing = DoingNone;
    }
  }

  // Extract the real command line.
  if (arg0) {
    this->RealArgC = argc - arg0;
    this->RealArgV = argv + arg0;
    for (int i = 0; i < this->RealArgC; ++i) {
      this->HandleRealArg(this->RealArgV[i]);
    }
    return true;
  }
  this->RealArgC = 0;
  this->RealArgV = nullptr;
  std::cerr << "No launch/command separator ('--') found!\n";
  return false;
}